

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileFStream::OpenChain
          (FileFStream *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  string *__rhs;
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  int iVar5;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Result_base *this_00;
  long *plVar7;
  size_type *psVar8;
  string *process;
  _Alloc_hider _Var9;
  int token;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  int local_18c;
  string local_188;
  string *local_168;
  long *local_160;
  element_type *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  Comm local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_18c = 1;
  __rhs = &(this->super_Transport).m_Name;
  local_168 = name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  iVar4 = helper::Comm::Rank(chainComm);
  if (0 < iVar4) {
    iVar4 = helper::Comm::Rank(chainComm);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"Chain token in FileFStream::OpenChain","");
    helper::Comm::Recv<int>((Status *)&local_158,chainComm,&local_18c,1,iVar4 + -1,0,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"open","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::fstream::open((string *)&this->m_FileStream,(_Ios_Openmode)local_168);
    std::ostream::seekp((long)&this->field_0x100,_S_beg);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)p_Var6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"open","");
    process = &local_b0;
LAB_0063a774:
    Transport::ProfilerStop(&this->super_Transport,process);
    _Var9._M_p = (process->_M_dataplus)._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_p == p_Var6) goto LAB_0063a78c;
  }
  else {
    if (openMode == Read) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      std::fstream::open((string *)&this->m_FileStream,(_Ios_Openmode)local_168);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)p_Var6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"open","");
      process = &local_f0;
      goto LAB_0063a774;
    }
    if (openMode == Write) {
      if ((async) && (iVar4 = helper::Comm::Size(chainComm), iVar4 == 1)) {
        this->m_IsOpening = true;
        local_188._M_dataplus._M_p = (pointer)0x0;
        local_188._M_string_length = 0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var6->_M_use_count = 1;
        p_Var6->_M_weak_count = 1;
        p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00873a80;
        p_Var6[1]._M_use_count = 0;
        p_Var6[1]._M_weak_count = 0;
        *(undefined4 *)&p_Var6[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&p_Var6[2]._vptr__Sp_counted_base + 4) = 0;
        p_Var6[2]._M_use_count = 0;
        p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var6[3]._M_use_count = 0;
        p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00873ad0;
        this_00 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)this_00 = 0;
        *(undefined8 *)(this_00 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(this_00);
        *(undefined ***)this_00 = &PTR__M_destroy_00872b90;
        p_Var6[4]._vptr__Sp_counted_base = (_func_int **)this_00;
        *(_Atomic_word **)&p_Var6[4]._M_use_count = &p_Var6[5]._M_use_count;
        pcVar1 = (local_168->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var6[4]._M_use_count,pcVar1,pcVar1 + local_168->_M_string_length);
        *(FileFStream **)&p_Var6[6]._M_use_count = this;
        local_158 = (element_type *)0x0;
        local_160 = (long *)operator_new(0x20);
        *local_160 = (long)&PTR___State_00873b28;
        local_160[1] = (long)(p_Var6 + 1);
        local_160[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:100:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
                             ::_M_run;
        local_160[3] = 0;
        std::thread::_M_start_thread(&local_158,&local_160,0);
        if (local_160 != (long *)0x0) {
          (**(code **)(*local_160 + 8))();
        }
        if (p_Var6[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var6[3]._vptr__Sp_counted_base = (_func_int **)local_158;
        local_188._M_dataplus._M_p = (pointer)(p_Var6 + 1);
        local_188._M_string_length = (size_type)p_Var6;
        std::__basic_future<void>::__basic_future
                  ((__basic_future<void> *)&local_158,(__state_type *)&local_188);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
        }
        p_Var3 = p_Stack_150;
        peVar2 = local_158;
        local_158 = (element_type *)0x0;
        p_Stack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var6 = (this->m_OpenFuture).super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar2;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var3;
        if ((p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6),
           p_Stack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_150);
        }
        goto LAB_0063a78c;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      helper::Comm::Rank(chainComm);
      std::fstream::open((string *)&this->m_FileStream,(_Ios_Openmode)local_168);
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)p_Var6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"open","");
      process = &local_70;
      goto LAB_0063a774;
    }
    std::operator+(&local_188,"unknown open mode for file ",__rhs);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110.field_2._8_8_ = plVar7[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar8;
      local_110._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_110._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CheckFile(this,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    _Var9._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_0063a78c;
  }
  operator_delete(_Var9._M_p);
LAB_0063a78c:
  if (this->m_IsOpening == false) {
    std::operator+(&local_188,"couldn\'t open file ",__rhs);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = plVar7[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_130._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CheckFile(this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  iVar4 = helper::Comm::Rank(chainComm);
  iVar5 = helper::Comm::Size(chainComm);
  if (iVar4 < iVar5 + -1) {
    iVar4 = helper::Comm::Rank(chainComm);
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"Sending Chain token in FileFStream::OpenChain","");
    helper::Comm::Isend<int>
              (&local_138,(int *)chainComm,(size_t)&local_18c,1,iVar4 + 1,(string *)0x0);
    helper::Comm::Req::~Req((Req *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FileFStream::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                            const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileFStream::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async && chainComm.Size() == 1)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            if (chainComm.Rank() == 0)
            {
                m_FileStream.open(name,
                                  std::fstream::out | std::fstream::binary | std::fstream::trunc);
            }
            else
            {
                m_FileStream.open(name, std::fstream::out | std::fstream::binary);
            }
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileFStream::OpenChain");
    }
}